

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrFoveationLevelProfileCreateInfoFB *value)

{
  bool bVar1;
  NextChainResult NVar2;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  XrResult XVar3;
  uint32_t in_stack_fffffffffffffd3c;
  allocator local_2b9;
  string local_2b8;
  string *local_298;
  allocator local_289;
  string local_288;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_208;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c0;
  string error_message;
  
  XVar3 = XR_SUCCESS;
  local_298 = command_name;
  if (value->type != XR_TYPE_FOVEATION_LEVEL_PROFILE_CREATE_INFO_FB) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrFoveationLevelProfileCreateInfoFB",
               value->type,"VUID-XrFoveationLevelProfileCreateInfoFB-type-type",
               XR_TYPE_FOVEATION_LEVEL_PROFILE_CREATE_INFO_FB,
               "XR_TYPE_FOVEATION_LEVEL_PROFILE_CREATE_INFO_FB");
  }
  if (!check_pnext) goto LAB_0017489c;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  error_message._M_dataplus._M_p._0_4_ = 0x3b9dd740;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  NVar2 = ValidateNextChain(instance_info,local_298,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar2 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_2b8);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_2b8,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::string
              ((string *)&local_2b8,"VUID-XrFoveationLevelProfileCreateInfoFB-next-unique",
               &local_2b9);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1d8,objects_info);
    std::__cxx11::string::string
              ((string *)&local_288,
               "Multiple structures of the same type(s) in \"next\" chain for XrFoveationLevelProfileCreateInfoFB struct"
               ,&local_289);
    CoreValidLogMessage(instance_info,&local_2b8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_298,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1d8,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1d8);
    std::__cxx11::string::~string((string *)&local_2b8);
LAB_00174867:
    std::__cxx11::string::~string((string *)&error_message);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar2 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrFoveationLevelProfileCreateInfoFB-next-next",
               (allocator *)&local_288);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1c0,objects_info);
    std::__cxx11::string::string
              ((string *)&local_2b8,
               "Invalid structure(s) in \"next\" chain for XrFoveationLevelProfileCreateInfoFB struct \"next\""
               ,&local_2b9);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_298,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1c0,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1c0);
    goto LAB_00174867;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_0017489c:
  if (check_members && XVar3 == XR_SUCCESS) {
    std::__cxx11::string::string
              ((string *)&error_message,"XrFoveationLevelProfileCreateInfoFB",
               (allocator *)&local_288);
    std::__cxx11::string::string((string *)&local_2b8,"level",(allocator *)&valid_ext_structs);
    bVar1 = ValidateXrEnum(instance_info,local_298,&error_message,&local_2b8,objects_info,
                           value->level);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&error_message);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&error_message,"XrFoveationLevelProfileCreateInfoFB",
                 (allocator *)&local_288);
      std::__cxx11::string::string((string *)&local_2b8,"dynamic",(allocator *)&valid_ext_structs);
      bVar1 = ValidateXrEnum(instance_info,local_298,&error_message,&local_2b8,objects_info,
                             value->dynamic);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&error_message);
      if (bVar1) {
        return XR_SUCCESS;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "XrFoveationLevelProfileCreateInfoFB contains invalid XrFoveationDynamicFB \"dynamic\" enum value "
                     );
      Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffd3c);
      std::operator<<((ostream *)&error_message,(string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::string
                ((string *)&local_2b8,"VUID-XrFoveationLevelProfileCreateInfoFB-dynamic-parameter",
                 (allocator *)&valid_ext_structs);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_208,objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&local_2b8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_298,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_208,&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      this = &local_208;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "XrFoveationLevelProfileCreateInfoFB contains invalid XrFoveationLevelFB \"level\" enum value "
                     );
      Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffd3c);
      std::operator<<((ostream *)&error_message,(string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::string
                ((string *)&local_2b8,"VUID-XrFoveationLevelProfileCreateInfoFB-level-parameter",
                 (allocator *)&valid_ext_structs);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1f0,objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&local_2b8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_298,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1f0,&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      this = &local_1f0;
    }
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  return XVar3;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrFoveationLevelProfileCreateInfoFB* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_FOVEATION_LEVEL_PROFILE_CREATE_INFO_FB) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrFoveationLevelProfileCreateInfoFB",
                             value->type, "VUID-XrFoveationLevelProfileCreateInfoFB-type-type", XR_TYPE_FOVEATION_LEVEL_PROFILE_CREATE_INFO_FB, "XR_TYPE_FOVEATION_LEVEL_PROFILE_CREATE_INFO_FB");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        valid_ext_structs.push_back(XR_TYPE_FOVEATION_EYE_TRACKED_PROFILE_CREATE_INFO_META);
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrFoveationLevelProfileCreateInfoFB-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrFoveationLevelProfileCreateInfoFB struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrFoveationLevelProfileCreateInfoFB : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrFoveationLevelProfileCreateInfoFB-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrFoveationLevelProfileCreateInfoFB struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrFoveationLevelFB value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrFoveationLevelProfileCreateInfoFB", "level", objects_info, value->level)) {
        std::ostringstream oss_enum;
        oss_enum << "XrFoveationLevelProfileCreateInfoFB contains invalid XrFoveationLevelFB \"level\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->level));
        CoreValidLogMessage(instance_info, "VUID-XrFoveationLevelProfileCreateInfoFB-level-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Make sure the enum type XrFoveationDynamicFB value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrFoveationLevelProfileCreateInfoFB", "dynamic", objects_info, value->dynamic)) {
        std::ostringstream oss_enum;
        oss_enum << "XrFoveationLevelProfileCreateInfoFB contains invalid XrFoveationDynamicFB \"dynamic\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->dynamic));
        CoreValidLogMessage(instance_info, "VUID-XrFoveationLevelProfileCreateInfoFB-dynamic-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}